

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

void swrenderer::R_MapPlane(int y,int x1)

{
  double dVar1;
  uint uVar2;
  double dVar3;
  
  uVar2 = (uint)spanend[y];
  if ((((x1 < 0) || ((int)uVar2 < x1)) || (viewwidth <= (int)uVar2)) ||
     ((uint)viewheight <= (uint)y)) {
    I_FatalError("R_MapPlane: %i, %i at %i",x1,(ulong)uVar2,(ulong)(uint)y);
  }
  dVar1 = (double)(float)(&yslope)[y] * planeheight;
  if (drawerargs::ds_xbits == 0) {
    drawerargs::ds_xstep = 0;
    drawerargs::ds_xfrac = 0;
  }
  else {
    dVar3 = 6755399441055744.0 / (double)(1 << (-(char)drawerargs::ds_xbits & 0x1fU));
    drawerargs::ds_xstep = SUB84(xstepscale * dVar1 + dVar3,0);
    drawerargs::ds_xfrac = SUB84(basexfrac * dVar1 + dVar3,0) + pviewx;
  }
  if (drawerargs::ds_ybits == 0) {
    drawerargs::ds_ystep = 0;
    drawerargs::ds_yfrac = 0;
  }
  else {
    dVar3 = 6755399441055744.0 / (double)(1 << (-(char)drawerargs::ds_ybits & 0x1fU));
    drawerargs::ds_ystep = SUB84(ystepscale * dVar1 + dVar3,0);
    drawerargs::ds_yfrac = SUB84(dVar1 * baseyfrac + dVar3,0) + pviewy;
  }
  if (plane_shade == true) {
    R_SetDSColorMapLight(basecolormap,(float)(ABS(CenterY - (double)y) * GlobVis),planeshade);
  }
  drawerargs::ds_y = y;
  drawerargs::ds_x1 = x1;
  drawerargs::ds_x2 = uVar2;
  (*spanfunc)();
  return;
}

Assistant:

void R_MapPlane (int y, int x1)
{
	int x2 = spanend[y];
	double distance;

#ifdef RANGECHECK
	if (x2 < x1 || x1<0 || x2>=viewwidth || (unsigned)y>=(unsigned)viewheight)
	{
		I_FatalError ("R_MapPlane: %i, %i at %i", x1, x2, y);
	}
#endif

	// [RH] Notice that I dumped the caching scheme used by Doom.
	// It did not offer any appreciable speedup.

	distance = planeheight * yslope[y];

	if (ds_xbits != 0)
	{
		ds_xstep = xs_ToFixed(32 - ds_xbits, distance * xstepscale);
		ds_xfrac = xs_ToFixed(32 - ds_xbits, distance * basexfrac) + pviewx;
	}
	else
	{
		ds_xstep = 0;
		ds_xfrac = 0;
	}
	if (ds_ybits != 0)
	{
		ds_ystep = xs_ToFixed(32 - ds_ybits, distance * ystepscale);
		ds_yfrac = xs_ToFixed(32 - ds_ybits, distance * baseyfrac) + pviewy;
	}
	else
	{
		ds_ystep = 0;
		ds_yfrac = 0;
	}

	if (plane_shade)
	{
		// Determine lighting based on the span's distance from the viewer.
		R_SetDSColorMapLight(basecolormap, GlobVis * fabs(CenterY - y), planeshade);
	}

	ds_y = y;
	ds_x1 = x1;
	ds_x2 = x2;

	spanfunc ();
}